

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O3

void iidentity8_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  undefined1 auVar34 [16];
  __m128i rnding;
  __m128i clamp_hi;
  __m128i clamp_lo;
  int local_28;
  int iStack_24;
  int iStack_20;
  int iStack_1c;
  int local_18;
  int iStack_14;
  int iStack_10;
  int iStack_c;
  
  iVar1 = (int)(*in)[0] * 2;
  iVar2 = *(int *)((long)*in + 4) * 2;
  iVar3 = (int)(*in)[1] * 2;
  iVar4 = *(int *)((long)*in + 0xc) * 2;
  *(int *)*out = iVar1;
  *(int *)((long)*out + 4) = iVar2;
  *(int *)(*out + 1) = iVar3;
  *(int *)((long)*out + 0xc) = iVar4;
  iVar5 = (int)in[1][0] * 2;
  iVar6 = *(int *)((long)in[1] + 4) * 2;
  iVar7 = (int)in[1][1] * 2;
  iVar8 = *(int *)((long)in[1] + 0xc) * 2;
  *(int *)out[1] = iVar5;
  *(int *)((long)out[1] + 4) = iVar6;
  *(int *)(out[1] + 1) = iVar7;
  *(int *)((long)out[1] + 0xc) = iVar8;
  iVar9 = (int)in[2][0] * 2;
  iVar10 = *(int *)((long)in[2] + 4) * 2;
  iVar11 = (int)in[2][1] * 2;
  iVar12 = *(int *)((long)in[2] + 0xc) * 2;
  *(int *)out[2] = iVar9;
  *(int *)((long)out[2] + 4) = iVar10;
  *(int *)(out[2] + 1) = iVar11;
  *(int *)((long)out[2] + 0xc) = iVar12;
  iVar13 = (int)in[3][0] * 2;
  iVar14 = *(int *)((long)in[3] + 4) * 2;
  iVar15 = (int)in[3][1] * 2;
  iVar16 = *(int *)((long)in[3] + 0xc) * 2;
  *(int *)out[3] = iVar13;
  *(int *)((long)out[3] + 4) = iVar14;
  *(int *)(out[3] + 1) = iVar15;
  *(int *)((long)out[3] + 0xc) = iVar16;
  iVar17 = (int)in[4][0] * 2;
  iVar18 = *(int *)((long)in[4] + 4) * 2;
  iVar19 = (int)in[4][1] * 2;
  iVar20 = *(int *)((long)in[4] + 0xc) * 2;
  *(int *)out[4] = iVar17;
  *(int *)((long)out[4] + 4) = iVar18;
  *(int *)(out[4] + 1) = iVar19;
  *(int *)((long)out[4] + 0xc) = iVar20;
  iVar21 = (int)in[5][0] * 2;
  iVar22 = *(int *)((long)in[5] + 4) * 2;
  iVar23 = (int)in[5][1] * 2;
  iVar24 = *(int *)((long)in[5] + 0xc) * 2;
  *(int *)out[5] = iVar21;
  *(int *)((long)out[5] + 4) = iVar22;
  *(int *)(out[5] + 1) = iVar23;
  *(int *)((long)out[5] + 0xc) = iVar24;
  iVar25 = (int)in[6][0] * 2;
  iVar26 = *(int *)((long)in[6] + 4) * 2;
  iVar27 = (int)in[6][1] * 2;
  iVar28 = *(int *)((long)in[6] + 0xc) * 2;
  *(int *)out[6] = iVar25;
  *(int *)((long)out[6] + 4) = iVar26;
  *(int *)(out[6] + 1) = iVar27;
  *(int *)((long)out[6] + 0xc) = iVar28;
  iVar29 = (int)in[7][0] * 2;
  iVar30 = *(int *)((long)in[7] + 4) * 2;
  iVar31 = (int)in[7][1] * 2;
  iVar32 = *(int *)((long)in[7] + 0xc) * 2;
  *(int *)out[7] = iVar29;
  *(int *)((long)out[7] + 4) = iVar30;
  *(int *)(out[7] + 1) = iVar31;
  *(int *)((long)out[7] + 0xc) = iVar32;
  if (do_cols != 0) {
    return;
  }
  iVar33 = 10;
  if (10 < bd) {
    iVar33 = bd;
  }
  local_28 = 0x20 << ((byte)iVar33 & 0x1f);
  local_18 = -local_28;
  local_28 = local_28 + -1;
  if (out_shift != 0) {
    iVar33 = 1 << ((char)out_shift - 1U & 0x1f);
    auVar34 = ZEXT416((uint)out_shift);
    *(int *)*out = iVar1 + iVar33 >> auVar34;
    *(int *)((long)*out + 4) = iVar2 + iVar33 >> auVar34;
    *(int *)(*out + 1) = iVar3 + iVar33 >> auVar34;
    *(int *)((long)*out + 0xc) = iVar4 + iVar33 >> auVar34;
    *(int *)out[1] = iVar5 + iVar33 >> auVar34;
    *(int *)((long)out[1] + 4) = iVar6 + iVar33 >> auVar34;
    *(int *)(out[1] + 1) = iVar7 + iVar33 >> auVar34;
    *(int *)((long)out[1] + 0xc) = iVar8 + iVar33 >> auVar34;
    *(int *)out[2] = iVar9 + iVar33 >> auVar34;
    *(int *)((long)out[2] + 4) = iVar10 + iVar33 >> auVar34;
    *(int *)(out[2] + 1) = iVar11 + iVar33 >> auVar34;
    *(int *)((long)out[2] + 0xc) = iVar12 + iVar33 >> auVar34;
    *(int *)out[3] = iVar13 + iVar33 >> auVar34;
    *(int *)((long)out[3] + 4) = iVar14 + iVar33 >> auVar34;
    *(int *)(out[3] + 1) = iVar15 + iVar33 >> auVar34;
    *(int *)((long)out[3] + 0xc) = iVar16 + iVar33 >> auVar34;
    *(int *)out[4] = iVar17 + iVar33 >> auVar34;
    *(int *)((long)out[4] + 4) = iVar18 + iVar33 >> auVar34;
    *(int *)(out[4] + 1) = iVar19 + iVar33 >> auVar34;
    *(int *)((long)out[4] + 0xc) = iVar20 + iVar33 >> auVar34;
    *(int *)out[5] = iVar21 + iVar33 >> auVar34;
    *(int *)((long)out[5] + 4) = iVar22 + iVar33 >> auVar34;
    *(int *)(out[5] + 1) = iVar23 + iVar33 >> auVar34;
    *(int *)((long)out[5] + 0xc) = iVar24 + iVar33 >> auVar34;
    *(int *)out[6] = iVar25 + iVar33 >> auVar34;
    *(int *)((long)out[6] + 4) = iVar26 + iVar33 >> auVar34;
    *(int *)(out[6] + 1) = iVar27 + iVar33 >> auVar34;
    *(int *)((long)out[6] + 0xc) = iVar28 + iVar33 >> auVar34;
    *(int *)out[7] = iVar29 + iVar33 >> auVar34;
    *(int *)((long)out[7] + 4) = iVar30 + iVar33 >> auVar34;
    *(int *)(out[7] + 1) = iVar31 + iVar33 >> auVar34;
    *(int *)((long)out[7] + 0xc) = iVar32 + iVar33 >> auVar34;
  }
  iStack_24 = local_28;
  iStack_20 = local_28;
  iStack_1c = local_28;
  iStack_14 = local_18;
  iStack_10 = local_18;
  iStack_c = local_18;
  highbd_clamp_epi32_sse4_1(out,out,(__m128i *)&local_18,(__m128i *)&local_28,8);
  return;
}

Assistant:

static void iidentity8_sse4_1(__m128i *in, __m128i *out, int bit, int do_cols,
                              int bd, int out_shift) {
  (void)bit;
  out[0] = _mm_add_epi32(in[0], in[0]);
  out[1] = _mm_add_epi32(in[1], in[1]);
  out[2] = _mm_add_epi32(in[2], in[2]);
  out[3] = _mm_add_epi32(in[3], in[3]);
  out[4] = _mm_add_epi32(in[4], in[4]);
  out[5] = _mm_add_epi32(in[5], in[5]);
  out[6] = _mm_add_epi32(in[6], in[6]);
  out[7] = _mm_add_epi32(in[7], in[7]);

  if (!do_cols) {
    const int log_range = AOMMAX(16, bd + 6);
    const __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
    const __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);
    round_shift_4x4(out, out_shift);
    round_shift_4x4(out + 4, out_shift);
    highbd_clamp_epi32_sse4_1(out, out, &clamp_lo, &clamp_hi, 8);
  }
}